

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform_subquery.cpp
# Opt level: O2

unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true> __thiscall
duckdb::Transformer::TransformSubquery(Transformer *this,PGSubLink *root)

{
  _Head_base<0UL,_duckdb::SelectStatement_*,_false> _Var1;
  pointer puVar2;
  _Head_base<0UL,_duckdb::OrderModifier_*,_false> _Var3;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> _Var4;
  _Head_base<0UL,_duckdb::TableRef_*,_false> _Var5;
  _Head_base<0UL,_duckdb::QueryNode_*,_false> _Var6;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> _Var7;
  _Head_base<0UL,_duckdb::FunctionExpression_*,_false> _Var8;
  _Head_base<0UL,_duckdb::TableRef_*,_false> _Var9;
  _Head_base<0UL,_duckdb::OrderModifier_*,_false> _Var10;
  _Head_base<0UL,_duckdb::SelectNode_*,_false> _Var11;
  _Alloc_hider _Var12;
  _Head_base<0UL,_duckdb::SelectStatement_*,_false> _Var13;
  ExpressionType EVar14;
  bool bVar15;
  pointer pSVar16;
  type pSVar17;
  PGValue *pPVar18;
  pointer pSVar19;
  pointer pQVar20;
  SelectNode *pSVar21;
  pointer pSVar22;
  pointer pRVar23;
  pointer pFVar24;
  pointer pOVar25;
  pointer pPVar26;
  BaseExpression *this_00;
  ConstantExpression *pCVar27;
  pointer pCVar28;
  pointer pSVar29;
  NotImplementedException *this_01;
  BinderException *this_02;
  ParserException *this_03;
  long in_RDX;
  pointer this_04;
  unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true> *this_05
  ;
  unsigned_long __val;
  _Head_base<0UL,_duckdb::SubqueryExpression_*,_false> local_140;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> local_138;
  _Head_base<0UL,_duckdb::FunctionExpression_*,_false> local_130;
  _Head_base<0UL,_duckdb::TableRef_*,_false> local_128;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> local_120;
  _Tuple_impl<0UL,_duckdb::CaseExpression_*,_std::default_delete<duckdb::CaseExpression>_> local_118
  ;
  _Head_base<0UL,_duckdb::OrderModifier_*,_false> local_110;
  _Head_base<0UL,_duckdb::SelectNode_*,_false> local_108;
  string error;
  _Head_base<0UL,_duckdb::SelectStatement_*,_false> local_e0;
  string operator_name;
  optional_ptr<duckdb::SelectNode,_true> sub_select;
  idx_t positional_index;
  __node_base local_70;
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
  children;
  LogicalType local_48;
  
  make_uniq<duckdb::SubqueryExpression>();
  TransformSelectStmt((Transformer *)&operator_name,(PGNode *)root,
                      SUB81(*(undefined8 *)(in_RDX + 0x20),0));
  pSVar16 = unique_ptr<duckdb::SubqueryExpression,_std::default_delete<duckdb::SubqueryExpression>,_true>
            ::operator->((unique_ptr<duckdb::SubqueryExpression,_std::default_delete<duckdb::SubqueryExpression>,_true>
                          *)&local_140);
  _Var12 = operator_name._M_dataplus;
  operator_name._M_dataplus._M_p = (pointer)0x0;
  _Var1._M_head_impl =
       (pSVar16->subquery).
       super_unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>_>._M_t
       .
       super___uniq_ptr_impl<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::SelectStatement_*,_std::default_delete<duckdb::SelectStatement>_>
       .super__Head_base<0UL,_duckdb::SelectStatement_*,_false>._M_head_impl;
  (pSVar16->subquery).
  super_unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>_>._M_t.
  super___uniq_ptr_impl<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>_>._M_t
  .super__Tuple_impl<0UL,_duckdb::SelectStatement_*,_std::default_delete<duckdb::SelectStatement>_>.
  super__Head_base<0UL,_duckdb::SelectStatement_*,_false>._M_head_impl =
       (SelectStatement *)_Var12._M_p;
  if ((_Var1._M_head_impl != (SelectStatement *)0x0) &&
     ((**(code **)(*(long *)&(_Var1._M_head_impl)->super_SQLStatement + 8))(),
     operator_name._M_dataplus._M_p != (pointer)0x0)) {
    (**(code **)(*(long *)operator_name._M_dataplus._M_p + 8))();
  }
  pSVar17 = unique_ptr<duckdb::SubqueryExpression,_std::default_delete<duckdb::SubqueryExpression>,_true>
            ::operator*((unique_ptr<duckdb::SubqueryExpression,_std::default_delete<duckdb::SubqueryExpression>,_true>
                         *)&local_140);
  SetQueryLocation(&pSVar17->super_ParsedExpression,*(int *)(in_RDX + 0x28));
  switch(*(undefined4 *)(in_RDX + 4)) {
  case 0:
    pSVar16 = unique_ptr<duckdb::SubqueryExpression,_std::default_delete<duckdb::SubqueryExpression>,_true>
              ::operator->((unique_ptr<duckdb::SubqueryExpression,_std::default_delete<duckdb::SubqueryExpression>,_true>
                            *)&local_140);
    pSVar16->subquery_type = EXISTS;
    break;
  case 1:
  case 2:
    pSVar16 = unique_ptr<duckdb::SubqueryExpression,_std::default_delete<duckdb::SubqueryExpression>,_true>
              ::operator->((unique_ptr<duckdb::SubqueryExpression,_std::default_delete<duckdb::SubqueryExpression>,_true>
                            *)&local_140);
    pSVar16->subquery_type = ANY;
    TransformExpression((Transformer *)&operator_name,
                        (optional_ptr<duckdb_libpgquery::PGNode,_true>)root);
    pSVar16 = unique_ptr<duckdb::SubqueryExpression,_std::default_delete<duckdb::SubqueryExpression>,_true>
              ::operator->((unique_ptr<duckdb::SubqueryExpression,_std::default_delete<duckdb::SubqueryExpression>,_true>
                            *)&local_140);
    _Var12 = operator_name._M_dataplus;
    operator_name._M_dataplus._M_p = (pointer)0x0;
    _Var4._M_head_impl =
         (pSVar16->child).
         super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
         _M_t.
         super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
         .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
    (pSVar16->child).
    super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>._M_t.
    super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
    _M_t.
    super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
    .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl =
         (ParsedExpression *)_Var12._M_p;
    if ((_Var4._M_head_impl != (ParsedExpression *)0x0) &&
       ((**(code **)(*(long *)&(_Var4._M_head_impl)->super_BaseExpression + 8))(),
       operator_name._M_dataplus._M_p != (pointer)0x0)) {
      (**(code **)(*(long *)operator_name._M_dataplus._M_p + 8))();
    }
    if (*(long *)(in_RDX + 0x18) == 0) {
      pSVar16 = unique_ptr<duckdb::SubqueryExpression,_std::default_delete<duckdb::SubqueryExpression>,_true>
                ::operator->((unique_ptr<duckdb::SubqueryExpression,_std::default_delete<duckdb::SubqueryExpression>,_true>
                              *)&local_140);
      pSVar16->comparison_type = COMPARE_BOUNDARY_START;
    }
    else {
      error._M_dataplus._M_p = (pointer)**(undefined8 **)(*(long *)(in_RDX + 0x18) + 8);
      pPVar18 = optional_ptr<duckdb_libpgquery::PGValue,_true>::operator->
                          ((optional_ptr<duckdb_libpgquery::PGValue,_true> *)&error);
      ::std::__cxx11::string::string
                ((string *)&operator_name,(pPVar18->val).str,(allocator *)&children);
      EVar14 = OperatorToExpressionType(&operator_name);
      pSVar16 = unique_ptr<duckdb::SubqueryExpression,_std::default_delete<duckdb::SubqueryExpression>,_true>
                ::operator->((unique_ptr<duckdb::SubqueryExpression,_std::default_delete<duckdb::SubqueryExpression>,_true>
                              *)&local_140);
      pSVar16->comparison_type = EVar14;
      ::std::__cxx11::string::~string((string *)&operator_name);
    }
    pSVar16 = unique_ptr<duckdb::SubqueryExpression,_std::default_delete<duckdb::SubqueryExpression>,_true>
              ::operator->((unique_ptr<duckdb::SubqueryExpression,_std::default_delete<duckdb::SubqueryExpression>,_true>
                            *)&local_140);
    if ((((pSVar16->comparison_type != COMPARE_BOUNDARY_START) &&
         (pSVar16 = unique_ptr<duckdb::SubqueryExpression,_std::default_delete<duckdb::SubqueryExpression>,_true>
                    ::operator->((unique_ptr<duckdb::SubqueryExpression,_std::default_delete<duckdb::SubqueryExpression>,_true>
                                  *)&local_140), pSVar16->comparison_type != COMPARE_NOTEQUAL)) &&
        (pSVar16 = unique_ptr<duckdb::SubqueryExpression,_std::default_delete<duckdb::SubqueryExpression>,_true>
                   ::operator->((unique_ptr<duckdb::SubqueryExpression,_std::default_delete<duckdb::SubqueryExpression>,_true>
                                 *)&local_140), pSVar16->comparison_type != COMPARE_GREATERTHAN)) &&
       (((pSVar16 = unique_ptr<duckdb::SubqueryExpression,_std::default_delete<duckdb::SubqueryExpression>,_true>
                    ::operator->((unique_ptr<duckdb::SubqueryExpression,_std::default_delete<duckdb::SubqueryExpression>,_true>
                                  *)&local_140),
         pSVar16->comparison_type != COMPARE_GREATERTHANOREQUALTO &&
         (pSVar16 = unique_ptr<duckdb::SubqueryExpression,_std::default_delete<duckdb::SubqueryExpression>,_true>
                    ::operator->((unique_ptr<duckdb::SubqueryExpression,_std::default_delete<duckdb::SubqueryExpression>,_true>
                                  *)&local_140), pSVar16->comparison_type != COMPARE_LESSTHAN)) &&
        (pSVar16 = unique_ptr<duckdb::SubqueryExpression,_std::default_delete<duckdb::SubqueryExpression>,_true>
                   ::operator->((unique_ptr<duckdb::SubqueryExpression,_std::default_delete<duckdb::SubqueryExpression>,_true>
                                 *)&local_140),
        pSVar16->comparison_type != COMPARE_LESSTHANOREQUALTO)))) {
      this_03 = (ParserException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&operator_name,
                 "ANY and ALL operators require one of =,<>,>,<,>=,<= comparisons!",
                 (allocator *)&error);
      ParserException::ParserException(this_03,&operator_name);
      __cxa_throw(this_03,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
    }
    if (*(int *)(in_RDX + 4) == 1) {
      pSVar16 = unique_ptr<duckdb::SubqueryExpression,_std::default_delete<duckdb::SubqueryExpression>,_true>
                ::operator->((unique_ptr<duckdb::SubqueryExpression,_std::default_delete<duckdb::SubqueryExpression>,_true>
                              *)&local_140);
      EVar14 = NegateComparisonExpression(pSVar16->comparison_type);
      pSVar16 = unique_ptr<duckdb::SubqueryExpression,_std::default_delete<duckdb::SubqueryExpression>,_true>
                ::operator->((unique_ptr<duckdb::SubqueryExpression,_std::default_delete<duckdb::SubqueryExpression>,_true>
                              *)&local_140);
      pSVar16->comparison_type = EVar14;
      error._M_dataplus._M_p._0_1_ = 0xd;
      make_uniq<duckdb::OperatorExpression,duckdb::ExpressionType,duckdb::unique_ptr<duckdb::SubqueryExpression,std::default_delete<duckdb::SubqueryExpression>,true>>
                ((duckdb *)&operator_name,(ExpressionType *)&error,
                 (unique_ptr<duckdb::SubqueryExpression,_std::default_delete<duckdb::SubqueryExpression>,_true>
                  *)&local_140);
      (this->parent).ptr = (Transformer *)operator_name._M_dataplus._M_p;
      if ((Transformer *)local_140._M_head_impl == (Transformer *)0x0) {
        return (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                )this;
      }
      (*(code *)((Transformer *)
                ((local_140._M_head_impl)->super_ParsedExpression).super_BaseExpression.
                _vptr_BaseExpression)->options)();
      return (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
              )this;
    }
    break;
  default:
    this_01 = (NotImplementedException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)&operator_name,"Subquery of type %d not implemented\n",(allocator *)&error)
    ;
    NotImplementedException::NotImplementedException<int>
              (this_01,&operator_name,*(int *)(in_RDX + 4));
    __cxa_throw(this_01,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
  case 4:
    pSVar16 = unique_ptr<duckdb::SubqueryExpression,_std::default_delete<duckdb::SubqueryExpression>,_true>
              ::operator->((unique_ptr<duckdb::SubqueryExpression,_std::default_delete<duckdb::SubqueryExpression>,_true>
                            *)&local_140);
    pSVar16->subquery_type = SCALAR;
    break;
  case 6:
    make_uniq<duckdb::SelectNode>();
    local_120._M_head_impl = (ParsedExpression *)0x0;
    sub_select.ptr = (SelectNode *)0x0;
    pSVar16 = unique_ptr<duckdb::SubqueryExpression,_std::default_delete<duckdb::SubqueryExpression>,_true>
              ::operator->((unique_ptr<duckdb::SubqueryExpression,_std::default_delete<duckdb::SubqueryExpression>,_true>
                            *)&local_140);
    pSVar19 = unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>,_true>
              ::operator->(&pSVar16->subquery);
    pQVar20 = unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>::
              operator->(&pSVar19->node);
    if (pQVar20->type == SELECT_NODE) {
      pSVar16 = unique_ptr<duckdb::SubqueryExpression,_std::default_delete<duckdb::SubqueryExpression>,_true>
                ::operator->((unique_ptr<duckdb::SubqueryExpression,_std::default_delete<duckdb::SubqueryExpression>,_true>
                              *)&local_140);
      pSVar19 = unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>,_true>
                ::operator->(&pSVar16->subquery);
      pQVar20 = unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>::
                operator->(&pSVar19->node);
      sub_select.ptr = QueryNode::Cast<duckdb::SelectNode>(pQVar20);
      pSVar21 = optional_ptr<duckdb::SelectNode,_true>::operator->(&sub_select);
      if ((long)(pSVar21->select_list).
                super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                .
                super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(pSVar21->select_list).
                super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                .
                super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                ._M_impl.super__Vector_impl_data._M_start != 8) {
        this_02 = (BinderException *)__cxa_allocate_exception(0x10);
        pSVar17 = unique_ptr<duckdb::SubqueryExpression,_std::default_delete<duckdb::SubqueryExpression>,_true>
                  ::operator*((unique_ptr<duckdb::SubqueryExpression,_std::default_delete<duckdb::SubqueryExpression>,_true>
                               *)&local_140);
        ::std::__cxx11::string::string
                  ((string *)&operator_name,"Subquery returns %zu columns - expected 1",
                   (allocator *)&error);
        pSVar21 = optional_ptr<duckdb::SelectNode,_true>::operator->(&sub_select);
        BinderException::BinderException<unsigned_long>
                  (this_02,&pSVar17->super_ParsedExpression,&operator_name,
                   (long)(pSVar21->select_list).
                         super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                         .
                         super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(pSVar21->select_list).
                         super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                         .
                         super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 3);
        __cxa_throw(this_02,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
      }
      error._M_dataplus._M_p = (pointer)0x1;
      make_uniq<duckdb::PositionalReferenceExpression,unsigned_long_long>
                ((duckdb *)&operator_name,(unsigned_long_long *)&error);
    }
    else {
      make_uniq<duckdb::StarExpression>();
      pSVar22 = unique_ptr<duckdb::StarExpression,_std::default_delete<duckdb::StarExpression>,_true>
                ::operator->((unique_ptr<duckdb::StarExpression,_std::default_delete<duckdb::StarExpression>,_true>
                              *)&operator_name);
      pSVar22->columns = true;
    }
    _Var12._M_p = operator_name._M_dataplus._M_p;
    _Var4._M_head_impl = local_120._M_head_impl;
    operator_name._M_dataplus._M_p = (pointer)0x0;
    local_120._M_head_impl = (ParsedExpression *)_Var12._M_p;
    if ((_Var4._M_head_impl != (ParsedExpression *)0x0) &&
       ((*((_Var4._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])(),
       operator_name._M_dataplus._M_p != (pointer)0x0)) {
      (**(code **)(*(long *)operator_name._M_dataplus._M_p + 8))();
    }
    children.
    super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
    .
    super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    children.
    super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
    .
    super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    children.
    super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
    .
    super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    ::std::
    vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
    ::
    emplace_back<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
              ((vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
                *)&children,
               (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                *)&local_120);
    make_uniq<duckdb::FunctionExpression,char_const(&)[10],duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,true>>
              ((duckdb *)&local_130,(char (*) [10])"array_agg",&children);
    pSVar16 = unique_ptr<duckdb::SubqueryExpression,_std::default_delete<duckdb::SubqueryExpression>,_true>
              ::operator->((unique_ptr<duckdb::SubqueryExpression,_std::default_delete<duckdb::SubqueryExpression>,_true>
                            *)&local_140);
    pSVar19 = unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>,_true>
              ::operator->(&pSVar16->subquery);
    pQVar20 = unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>::
              operator->(&pSVar19->node);
    puVar2 = (pQVar20->modifiers).
             super_vector<duckdb::unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>,_true>_>_>
             .
             super__Vector_base<duckdb::unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (this_04 = (pQVar20->modifiers).
                   super_vector<duckdb::unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>,_true>_>_>
                   .
                   super__Vector_base<duckdb::unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>,_true>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; this_04 != puVar2;
        this_04 = this_04 + 1) {
      pRVar23 = unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>,_true>
                ::operator->(this_04);
      if (pRVar23->type == ORDER_MODIFIER) {
        pRVar23 = unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>,_true>
                  ::operator->(this_04);
        (*pRVar23->_vptr_ResultModifier[3])(&local_110,pRVar23);
        _Var10._M_head_impl = local_110._M_head_impl;
        local_110._M_head_impl = (OrderModifier *)0x0;
        pFVar24 = unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>,_true>
                  ::operator->((unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>,_true>
                                *)&local_130);
        _Var3._M_head_impl =
             (pFVar24->order_bys).
             super_unique_ptr<duckdb::OrderModifier,_std::default_delete<duckdb::OrderModifier>_>.
             _M_t.
             super___uniq_ptr_impl<duckdb::OrderModifier,_std::default_delete<duckdb::OrderModifier>_>
             ._M_t.
             super__Tuple_impl<0UL,_duckdb::OrderModifier_*,_std::default_delete<duckdb::OrderModifier>_>
             .super__Head_base<0UL,_duckdb::OrderModifier_*,_false>._M_head_impl;
        (pFVar24->order_bys).
        super_unique_ptr<duckdb::OrderModifier,_std::default_delete<duckdb::OrderModifier>_>._M_t.
        super___uniq_ptr_impl<duckdb::OrderModifier,_std::default_delete<duckdb::OrderModifier>_>.
        _M_t.
        super__Tuple_impl<0UL,_duckdb::OrderModifier_*,_std::default_delete<duckdb::OrderModifier>_>
        .super__Head_base<0UL,_duckdb::OrderModifier_*,_false>._M_head_impl = _Var10._M_head_impl;
        if (_Var3._M_head_impl != (OrderModifier *)0x0) {
          (**(code **)(*(long *)&(_Var3._M_head_impl)->super_ResultModifier + 8))();
        }
        if (local_110._M_head_impl != (OrderModifier *)0x0) {
          (*((local_110._M_head_impl)->super_ResultModifier)._vptr_ResultModifier[1])();
        }
        local_110._M_head_impl = (OrderModifier *)0x0;
        break;
      }
    }
    pFVar24 = unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>,_true>
              ::operator->((unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>,_true>
                            *)&local_130);
    if ((pFVar24->order_bys).
        super_unique_ptr<duckdb::OrderModifier,_std::default_delete<duckdb::OrderModifier>_>._M_t.
        super___uniq_ptr_impl<duckdb::OrderModifier,_std::default_delete<duckdb::OrderModifier>_>.
        _M_t.
        super__Tuple_impl<0UL,_duckdb::OrderModifier_*,_std::default_delete<duckdb::OrderModifier>_>
        .super__Head_base<0UL,_duckdb::OrderModifier_*,_false>._M_head_impl != (OrderModifier *)0x0)
    {
      pFVar24 = unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>,_true>
                ::operator->((unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>,_true>
                              *)&local_130);
      pOVar25 = unique_ptr<duckdb::OrderModifier,_std::default_delete<duckdb::OrderModifier>,_true>
                ::operator->(&pFVar24->order_bys);
      local_70._M_nxt =
           (_Hash_node_base *)
           (pOVar25->orders).super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>
           .super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>._M_impl.
           super__Vector_impl_data._M_finish;
      __val = 0;
      for (this_05 = &((pOVar25->orders).
                       super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
                       super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>
                       ._M_impl.super__Vector_impl_data._M_start)->expression;
          (OrderByNode *)(this_05 + -1) != (OrderByNode *)local_70._M_nxt; this_05 = this_05 + 2) {
        pPVar26 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                  ::operator->(this_05);
        if ((pPVar26->super_BaseExpression).type == VALUE_CONSTANT) {
          this_00 = &unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                     ::operator->(this_05)->super_BaseExpression;
          pCVar27 = BaseExpression::Cast<duckdb::ConstantExpression>(this_00);
          LogicalType::LogicalType(&local_48,SQLNULL);
          Value::Value((Value *)&operator_name,&local_48);
          LogicalType::~LogicalType(&local_48);
          error._M_dataplus._M_p = (pointer)&error.field_2;
          error._M_string_length = 0;
          error.field_2._M_local_buf[0] = '\0';
          LogicalType::LogicalType((LogicalType *)&positional_index,BIGINT);
          bVar15 = Value::DefaultTryCastAs
                             (&pCVar27->value,(LogicalType *)&positional_index,
                              (Value *)&operator_name,&error,false);
          LogicalType::~LogicalType((LogicalType *)&positional_index);
          if (bVar15) {
            positional_index = BigIntValue::Get((Value *)&operator_name);
            if ((long)positional_index < 0) {
              positional_index = 0xffffffffffffffff;
            }
            make_uniq<duckdb::PositionalReferenceExpression,unsigned_long&>
                      ((duckdb *)&local_138,&positional_index);
            _Var7._M_head_impl = local_138._M_head_impl;
            local_138._M_head_impl = (ParsedExpression *)0x0;
            _Var4._M_head_impl =
                 (this_05->
                 super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                 )._M_t.
                 super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
                 .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
            (this_05->
            super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
            )._M_t.
            super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
            ._M_t.
            super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
            .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl =
                 _Var7._M_head_impl;
            if ((_Var4._M_head_impl != (ParsedExpression *)0x0) &&
               ((**(code **)(*(long *)&(_Var4._M_head_impl)->super_BaseExpression + 8))(),
               local_138._M_head_impl != (ParsedExpression *)0x0)) {
              (*((local_138._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
            }
          }
          ::std::__cxx11::string::~string((string *)&error);
          Value::~Value((Value *)&operator_name);
        }
        else if (sub_select.ptr == (SelectNode *)0x0) {
          RemoveOrderQualificationRecursive(this_05);
        }
        else {
          __val = __val + 1;
          ::std::__cxx11::to_string(&error,__val);
          ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &operator_name,"__array_internal_idx_",&error);
          ::std::__cxx11::string::~string((string *)&error);
          pPVar26 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                    ::operator->(this_05);
          ::std::__cxx11::string::_M_assign((string *)&(pPVar26->super_BaseExpression).alias);
          pSVar21 = optional_ptr<duckdb::SelectNode,_true>::operator->(&sub_select);
          ::std::
          vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
          ::
          emplace_back<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
                    ((vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
                      *)&pSVar21->select_list,this_05);
          make_uniq<duckdb::ColumnRefExpression,std::__cxx11::string&>
                    ((duckdb *)&error,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &operator_name);
          _Var12 = error._M_dataplus;
          error._M_dataplus._M_p = (pointer)0x0;
          _Var4._M_head_impl =
               (this_05->
               super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
               )._M_t.
               super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
               ._M_t.
               super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
               .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
          (this_05->
          super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
          )._M_t.
          super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
          ._M_t.
          super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
          .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl =
               (ParsedExpression *)_Var12._M_p;
          if ((_Var4._M_head_impl != (ParsedExpression *)0x0) &&
             ((**(code **)(*(long *)&(_Var4._M_head_impl)->super_BaseExpression + 8))(),
             error._M_dataplus._M_p != (pointer)0x0)) {
            (**(code **)(*(long *)error._M_dataplus._M_p + 8))();
          }
          ::std::__cxx11::string::~string((string *)&operator_name);
        }
      }
    }
    error._M_dataplus._M_p._0_1_ = 0xe;
    pFVar24 = unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>,_true>
              ::operator->((unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>,_true>
                            *)&local_130);
    (*(pFVar24->super_ParsedExpression).super_BaseExpression._vptr_BaseExpression[0xc])
              (&operator_name,pFVar24);
    make_uniq<duckdb::OperatorExpression,duckdb::ExpressionType,duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
              ((duckdb *)&positional_index,(ExpressionType *)&error,
               (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                *)&operator_name);
    if (operator_name._M_dataplus._M_p != (pointer)0x0) {
      (**(code **)(*(long *)operator_name._M_dataplus._M_p + 8))();
    }
    operator_name._M_dataplus._M_p = (pointer)0x0;
    operator_name._M_string_length = 0;
    operator_name.field_2._M_allocated_capacity = 0;
    make_uniq<duckdb::FunctionExpression,char_const(&)[11],duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,true>>
              ((duckdb *)&local_138,(char (*) [11])"list_value",
               (vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                *)&operator_name);
    make_uniq<duckdb::CaseExpression>();
    error._M_dataplus._M_p = (pointer)positional_index;
    error._M_string_length = (size_type)local_138;
    positional_index = 0;
    local_138._M_head_impl = (ParsedExpression *)0x0;
    pCVar28 = unique_ptr<duckdb::CaseExpression,_std::default_delete<duckdb::CaseExpression>,_true>
              ::operator->((unique_ptr<duckdb::CaseExpression,_std::default_delete<duckdb::CaseExpression>,_true>
                            *)&local_118);
    ::std::vector<duckdb::CaseCheck,_std::allocator<duckdb::CaseCheck>_>::
    emplace_back<duckdb::CaseCheck>
              (&(pCVar28->case_checks).
                super_vector<duckdb::CaseCheck,_std::allocator<duckdb::CaseCheck>_>,
               (CaseCheck *)&error);
    _Var8._M_head_impl = local_130._M_head_impl;
    local_130._M_head_impl = (FunctionExpression *)0x0;
    pCVar28 = unique_ptr<duckdb::CaseExpression,_std::default_delete<duckdb::CaseExpression>,_true>
              ::operator->((unique_ptr<duckdb::CaseExpression,_std::default_delete<duckdb::CaseExpression>,_true>
                            *)&local_118);
    _Var4._M_head_impl =
         (pCVar28->else_expr).
         super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
         _M_t.
         super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
         .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
    (pCVar28->else_expr).
    super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>._M_t.
    super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
    _M_t.
    super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
    .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl =
         &(_Var8._M_head_impl)->super_ParsedExpression;
    if (_Var4._M_head_impl != (ParsedExpression *)0x0) {
      (**(code **)(*(long *)&(_Var4._M_head_impl)->super_BaseExpression + 8))();
    }
    pSVar29 = unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>::
              operator->((unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>
                          *)&local_108);
    local_128._M_head_impl =
         (TableRef *)local_118.super__Head_base<0UL,_duckdb::CaseExpression_*,_false>._M_head_impl;
    local_118.super__Head_base<0UL,_duckdb::CaseExpression_*,_false>._M_head_impl =
         (_Head_base<0UL,_duckdb::CaseExpression_*,_false>)(CaseExpression *)0x0;
    ::std::
    vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
    ::
    emplace_back<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
              ((vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
                *)&pSVar29->select_list,
               (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                *)&local_128);
    if (local_128._M_head_impl != (TableRef *)0x0) {
      (*(local_128._M_head_impl)->_vptr_TableRef[1])();
    }
    pSVar16 = unique_ptr<duckdb::SubqueryExpression,_std::default_delete<duckdb::SubqueryExpression>,_true>
              ::operator->((unique_ptr<duckdb::SubqueryExpression,_std::default_delete<duckdb::SubqueryExpression>,_true>
                            *)&local_140);
    make_uniq<duckdb::SubqueryRef,duckdb::unique_ptr<duckdb::SelectStatement,std::default_delete<duckdb::SelectStatement>,true>>
              ((duckdb *)&local_128,&pSVar16->subquery);
    _Var9._M_head_impl = local_128._M_head_impl;
    local_128._M_head_impl = (TableRef *)0x0;
    pSVar29 = unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>::
              operator->((unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>
                          *)&local_108);
    _Var5._M_head_impl =
         (pSVar29->from_table).
         super_unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>._M_t.
         super___uniq_ptr_impl<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>._M_t.
         super__Tuple_impl<0UL,_duckdb::TableRef_*,_std::default_delete<duckdb::TableRef>_>.
         super__Head_base<0UL,_duckdb::TableRef_*,_false>._M_head_impl;
    (pSVar29->from_table).super_unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>
    ._M_t.super___uniq_ptr_impl<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::TableRef_*,_std::default_delete<duckdb::TableRef>_>.
    super__Head_base<0UL,_duckdb::TableRef_*,_false>._M_head_impl = _Var9._M_head_impl;
    if (_Var5._M_head_impl != (TableRef *)0x0) {
      (**(code **)((long)(_Var5._M_head_impl)->_vptr_TableRef + 8))();
    }
    make_uniq<duckdb::SelectStatement>();
    _Var11._M_head_impl = local_108._M_head_impl;
    local_108._M_head_impl = (SelectNode *)0x0;
    pSVar19 = unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>,_true>
              ::operator->((unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>,_true>
                            *)&local_e0);
    _Var6._M_head_impl =
         (pSVar19->node).
         super_unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
         super___uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
         super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>.
         super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl;
    (pSVar19->node).super_unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>.
    _M_t.super___uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>.
    super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl =
         &(_Var11._M_head_impl)->super_QueryNode;
    if (_Var6._M_head_impl != (QueryNode *)0x0) {
      (**(code **)((long)(_Var6._M_head_impl)->_vptr_QueryNode + 8))();
    }
    pSVar16 = unique_ptr<duckdb::SubqueryExpression,_std::default_delete<duckdb::SubqueryExpression>,_true>
              ::operator->((unique_ptr<duckdb::SubqueryExpression,_std::default_delete<duckdb::SubqueryExpression>,_true>
                            *)&local_140);
    _Var13._M_head_impl = local_e0._M_head_impl;
    local_e0._M_head_impl = (SelectStatement *)0x0;
    _Var1._M_head_impl =
         (pSVar16->subquery).
         super_unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>_>.
         _M_t.
         super___uniq_ptr_impl<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::SelectStatement_*,_std::default_delete<duckdb::SelectStatement>_>
         .super__Head_base<0UL,_duckdb::SelectStatement_*,_false>._M_head_impl;
    (pSVar16->subquery).
    super_unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>_>._M_t.
    super___uniq_ptr_impl<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>_>.
    _M_t.
    super__Tuple_impl<0UL,_duckdb::SelectStatement_*,_std::default_delete<duckdb::SelectStatement>_>
    .super__Head_base<0UL,_duckdb::SelectStatement_*,_false>._M_head_impl = _Var13._M_head_impl;
    if (_Var1._M_head_impl != (SelectStatement *)0x0) {
      (**(code **)(*(long *)&(_Var1._M_head_impl)->super_SQLStatement + 8))();
    }
    pSVar16 = unique_ptr<duckdb::SubqueryExpression,_std::default_delete<duckdb::SubqueryExpression>,_true>
              ::operator->((unique_ptr<duckdb::SubqueryExpression,_std::default_delete<duckdb::SubqueryExpression>,_true>
                            *)&local_140);
    pSVar16->subquery_type = SCALAR;
    if (local_e0._M_head_impl != (SelectStatement *)0x0) {
      (*((local_e0._M_head_impl)->super_SQLStatement)._vptr_SQLStatement[1])();
    }
    if (local_128._M_head_impl != (TableRef *)0x0) {
      (*(local_128._M_head_impl)->_vptr_TableRef[1])();
    }
    CaseCheck::~CaseCheck((CaseCheck *)&error);
    if (local_118.super__Head_base<0UL,_duckdb::CaseExpression_*,_false>._M_head_impl !=
        (CaseExpression *)0x0) {
      (**(code **)(*(long *)local_118.super__Head_base<0UL,_duckdb::CaseExpression_*,_false>.
                            _M_head_impl + 8))();
    }
    if (local_138._M_head_impl != (ParsedExpression *)0x0) {
      (**(code **)(*(long *)local_138._M_head_impl + 8))();
    }
    ::std::
    vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
    ::~vector((vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
               *)&operator_name);
    if (positional_index != 0) {
      (**(code **)(*(long *)positional_index + 8))();
    }
    if (local_130._M_head_impl != (FunctionExpression *)0x0) {
      (*((local_130._M_head_impl)->super_ParsedExpression).super_BaseExpression._vptr_BaseExpression
        [1])();
    }
    ::std::
    vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
    ::~vector(&children.
               super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
             );
    if (local_120._M_head_impl != (ParsedExpression *)0x0) {
      (*((local_120._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
    }
    if (local_108._M_head_impl != (SelectNode *)0x0) {
      (*((local_108._M_head_impl)->super_QueryNode)._vptr_QueryNode[1])();
    }
  }
  (this->parent).ptr = (Transformer *)local_140._M_head_impl;
  return (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)
         (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)this;
}

Assistant:

unique_ptr<ParsedExpression> Transformer::TransformSubquery(duckdb_libpgquery::PGSubLink &root) {
	auto subquery_expr = make_uniq<SubqueryExpression>();

	subquery_expr->subquery = TransformSelectStmt(*root.subselect);
	SetQueryLocation(*subquery_expr, root.location);
	D_ASSERT(subquery_expr->subquery);
	D_ASSERT(!subquery_expr->subquery->node->GetSelectList().empty());

	switch (root.subLinkType) {
	case duckdb_libpgquery::PG_EXISTS_SUBLINK: {
		subquery_expr->subquery_type = SubqueryType::EXISTS;
		break;
	}
	case duckdb_libpgquery::PG_ANY_SUBLINK:
	case duckdb_libpgquery::PG_ALL_SUBLINK: {
		// comparison with ANY() or ALL()
		subquery_expr->subquery_type = SubqueryType::ANY;
		subquery_expr->child = TransformExpression(root.testexpr);
		// get the operator name
		if (!root.operName) {
			// simple IN
			subquery_expr->comparison_type = ExpressionType::COMPARE_EQUAL;
		} else {
			auto operator_name =
			    string((PGPointerCast<duckdb_libpgquery::PGValue>(root.operName->head->data.ptr_value))->val.str);
			subquery_expr->comparison_type = OperatorToExpressionType(operator_name);
		}
		if (subquery_expr->comparison_type != ExpressionType::COMPARE_EQUAL &&
		    subquery_expr->comparison_type != ExpressionType::COMPARE_NOTEQUAL &&
		    subquery_expr->comparison_type != ExpressionType::COMPARE_GREATERTHAN &&
		    subquery_expr->comparison_type != ExpressionType::COMPARE_GREATERTHANOREQUALTO &&
		    subquery_expr->comparison_type != ExpressionType::COMPARE_LESSTHAN &&
		    subquery_expr->comparison_type != ExpressionType::COMPARE_LESSTHANOREQUALTO) {
			throw ParserException("ANY and ALL operators require one of =,<>,>,<,>=,<= comparisons!");
		}
		if (root.subLinkType == duckdb_libpgquery::PG_ALL_SUBLINK) {
			// ALL sublink is equivalent to NOT(ANY) with inverted comparison
			// e.g. [= ALL()] is equivalent to [NOT(<> ANY())]
			// first invert the comparison type
			subquery_expr->comparison_type = NegateComparisonExpression(subquery_expr->comparison_type);
			return make_uniq<OperatorExpression>(ExpressionType::OPERATOR_NOT, std::move(subquery_expr));
		}
		break;
	}
	case duckdb_libpgquery::PG_EXPR_SUBLINK: {
		// return a single scalar value from the subquery
		// no child expression to compare to
		subquery_expr->subquery_type = SubqueryType::SCALAR;
		break;
	}
	case duckdb_libpgquery::PG_ARRAY_SUBLINK: {
		// ARRAY expression
		// wrap subquery into
		// "SELECT CASE WHEN ARRAY_AGG(col) IS NULL THEN [] ELSE ARRAY_AGG(col) END FROM (...) tbl"
		auto select_node = make_uniq<SelectNode>();

		unique_ptr<ParsedExpression> array_agg_child;
		optional_ptr<SelectNode> sub_select;
		if (subquery_expr->subquery->node->type == QueryNodeType::SELECT_NODE) {
			// easy case - subquery is a SELECT
			sub_select = subquery_expr->subquery->node->Cast<SelectNode>();
			if (sub_select->select_list.size() != 1) {
				throw BinderException(*subquery_expr, "Subquery returns %zu columns - expected 1",
				                      sub_select->select_list.size());
			}
			array_agg_child = make_uniq<PositionalReferenceExpression>(1ULL);
		} else {
			// subquery is not a SELECT but a UNION or CTE
			// we can still support this but it is more challenging since we can't push columns for the ORDER BY
			auto columns_star = make_uniq<StarExpression>();
			columns_star->columns = true;
			array_agg_child = std::move(columns_star);
		}

		// ARRAY_AGG(COLUMNS(*))
		vector<unique_ptr<ParsedExpression>> children;
		children.push_back(std::move(array_agg_child));
		auto aggr = make_uniq<FunctionExpression>("array_agg", std::move(children));
		// push ORDER BY modifiers into the array_agg
		for (auto &modifier : subquery_expr->subquery->node->modifiers) {
			if (modifier->type == ResultModifierType::ORDER_MODIFIER) {
				aggr->order_bys = unique_ptr_cast<ResultModifier, OrderModifier>(modifier->Copy());
				break;
			}
		}
		// transform constants (e.g. ORDER BY 1) into positional references (ORDER BY #1)
		idx_t array_idx = 0;
		if (aggr->order_bys) {
			for (auto &order : aggr->order_bys->orders) {
				if (order.expression->GetExpressionType() == ExpressionType::VALUE_CONSTANT) {
					auto &constant_expr = order.expression->Cast<ConstantExpression>();
					Value bigint_value;
					string error;
					if (constant_expr.value.DefaultTryCastAs(LogicalType::BIGINT, bigint_value, &error)) {
						int64_t order_index = BigIntValue::Get(bigint_value);
						idx_t positional_index = order_index < 0 ? NumericLimits<idx_t>::Maximum() : idx_t(order_index);
						order.expression = make_uniq<PositionalReferenceExpression>(positional_index);
					}
				} else if (sub_select) {
					// if we have a SELECT we can push the ORDER BY clause into the SELECT list and reference it
					auto alias = "__array_internal_idx_" + to_string(++array_idx);
					order.expression->alias = alias;
					sub_select->select_list.push_back(std::move(order.expression));
					order.expression = make_uniq<ColumnRefExpression>(alias);
				} else {
					// otherwise we remove order qualifications
					RemoveOrderQualificationRecursive(order.expression);
				}
			}
		}
		// ARRAY_AGG(COLUMNS(*)) IS NULL
		auto agg_is_null = make_uniq<OperatorExpression>(ExpressionType::OPERATOR_IS_NULL, aggr->Copy());
		// empty list
		vector<unique_ptr<ParsedExpression>> list_children;
		auto empty_list = make_uniq<FunctionExpression>("list_value", std::move(list_children));
		// CASE
		auto case_expr = make_uniq<CaseExpression>();
		CaseCheck check;
		check.when_expr = std::move(agg_is_null);
		check.then_expr = std::move(empty_list);
		case_expr->case_checks.push_back(std::move(check));
		case_expr->else_expr = std::move(aggr);

		select_node->select_list.push_back(std::move(case_expr));

		// FROM (...) tbl
		auto child_subquery = make_uniq<SubqueryRef>(std::move(subquery_expr->subquery));
		select_node->from_table = std::move(child_subquery);

		auto new_subquery = make_uniq<SelectStatement>();
		new_subquery->node = std::move(select_node);
		subquery_expr->subquery = std::move(new_subquery);

		subquery_expr->subquery_type = SubqueryType::SCALAR;
		break;
	}
	default:
		throw NotImplementedException("Subquery of type %d not implemented\n", (int)root.subLinkType);
	}
	return std::move(subquery_expr);
}